

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
pstore::database::database(database *this,string *path,access_mode am,bool access_tick_enabled)

{
  file_base *file;
  typed_address<pstore::trailer> footer_pos;
  undefined1 local_30 [27];
  bool access_tick_enabled_local;
  access_mode am_local;
  string *path_local;
  database *this_local;
  
  this->_vptr_database = (_func_int **)&PTR__database_00182238;
  local_30[0x13] = access_tick_enabled;
  local_30._20_4_ = am;
  unique0x1000015b = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  path_local = (string *)this;
  open((database *)local_30,(char *)path,am);
  storage::storage<pstore::file::file_handle>
            (&this->storage_,(shared_ptr<pstore::file::file_handle> *)local_30);
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr
            ((shared_ptr<pstore::file::file_handle> *)local_30);
  std::shared_ptr<pstore::header>::shared_ptr(&this->header_);
  pstore::file::range_lock::range_lock(&this->range_lock_);
  std::unique_lock<pstore::file::range_lock>::unique_lock(&this->lock_);
  this->vacuum_mode_ = disabled;
  this->modified_ = false;
  this->closed_ = false;
  file = database::file(this);
  footer_pos = get_footer_pos<pstore::file::file_base>(file);
  sizes::sizes(&this->size_,footer_pos);
  std::array<std::shared_ptr<pstore::index::index_base>,_6UL>::array(&this->indices_);
  std::__cxx11::string::string((string *)&this->sync_name_);
  finish_init(this,(bool)(local_30[0x13] & 1));
  return;
}

Assistant:

database::database (std::string const & path, access_mode const am,
                        bool const access_tick_enabled)
            : storage_{database::open (path, am)}
            , size_{database::get_footer_pos (*this->file ())} {

        this->finish_init (access_tick_enabled);
    }